

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O1

void Cudd_SymmProfile(DdManager *table,int lower,int upper)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  uVar3 = 0;
  if (lower <= upper) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar2 = lower;
      if (table->subtables[lower].next != lower) {
        fwrite("Group:",6,1,(FILE *)table->out);
        uVar1 = lower;
        do {
          uVar2 = uVar1;
          fprintf((FILE *)table->out,"  %d",(ulong)(uint)table->invperm[(int)uVar2]);
          uVar4 = uVar4 + 1;
          uVar1 = table->subtables[(int)uVar2].next;
        } while (uVar1 != lower);
        uVar3 = uVar3 + 1;
        fputc(10,(FILE *)table->out);
      }
      lower = uVar2 + 1;
    } while ((int)uVar2 < upper);
  }
  fprintf((FILE *)table->out,"Total Symmetric = %d\n",(ulong)uVar4);
  fprintf((FILE *)table->out,"Total Groups = %d\n",(ulong)uVar3);
  return;
}

Assistant:

void
Cudd_SymmProfile(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i,x,gbot;
    int TotalSymm = 0;
    int TotalSymmGroups = 0;

    for (i = lower; i <= upper; i++) {
        if (table->subtables[i].next != (unsigned) i) {
            x = i;
            (void) fprintf(table->out,"Group:");
            do {
                (void) fprintf(table->out,"  %d",table->invperm[x]);
                TotalSymm++;
                gbot = x;
                x = table->subtables[x].next;
            } while (x != i);
            TotalSymmGroups++;
#ifdef DD_DEBUG
            assert(table->subtables[gbot].next == (unsigned) i);
#endif
            i = gbot;
            (void) fprintf(table->out,"\n");
        }
    }
    (void) fprintf(table->out,"Total Symmetric = %d\n",TotalSymm);
    (void) fprintf(table->out,"Total Groups = %d\n",TotalSymmGroups);

}